

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.cpp
# Opt level: O0

void boost::deflate::easy_test::test_uncompress(void)

{
  runner *prVar1;
  bool cond;
  runner **pprVar2;
  wrap in_R8B;
  wrap wVar3;
  string_view in;
  string_view in_00;
  string_view in_01;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  pprVar2 = test_suite::detail::current();
  prVar1 = *pprVar2;
  basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"");
  in.len_ = 0;
  in.ptr_ = (char *)local_40.len_;
  easy_uncompress_abi_cxx11_(&local_30,(deflate *)local_40.ptr_,in,in_R8B);
  wVar3 = 0x1b;
  test_suite::detail::runner::maybe_fail<boost::optional<std::__cxx11::string>>
            (prVar1,&local_30,"easy_uncompress(\"\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/easy.cpp"
             ,0x1b,"static void boost::deflate::easy_test::test_uncompress()",(char *)0x0);
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_30);
  pprVar2 = test_suite::detail::current();
  prVar1 = *pprVar2;
  basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"");
  in_00.len_ = 0;
  in_00.ptr_ = (char *)local_88.len_;
  easy_uncompress_abi_cxx11_(&local_78,(deflate *)local_88.ptr_,in_00,wVar3);
  wVar3 = 0x1c;
  test_suite::detail::runner::maybe_fail<boost::optional<std::__cxx11::string>>
            (prVar1,&local_78,
             "easy_uncompress(\"\\x00\\x05\\x00\\xfa\\xff\\x48\\x65\\x6c\\x6c\\x6f\\x00\\x00\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/easy.cpp"
             ,0x1c,"static void boost::deflate::easy_test::test_uncompress()",(char *)0x0);
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_78);
  pprVar2 = test_suite::detail::current();
  prVar1 = *pprVar2;
  basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c0,"This is a test string");
  in_01.len_ = 0;
  in_01.ptr_ = (char *)local_c0.len_;
  easy_uncompress_abi_cxx11_(&local_b0,(deflate *)local_c0.ptr_,in_01,wVar3);
  cond = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator!(&local_b0);
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,cond,"!easy_uncompress(\"This is a test string\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/easy.cpp"
             ,0x1d,"static void boost::deflate::easy_test::test_uncompress()",(char *)0x0);
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_b0);
  return;
}

Assistant:

static void test_uncompress() {
      BOOST_TEST(easy_uncompress(""));
      BOOST_TEST(easy_uncompress("\x00\x05\x00\xfa\xff\x48\x65\x6c\x6c\x6f\x00\x00"));
      BOOST_TEST(!easy_uncompress("This is a test string"));
  }